

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O3

Label * __thiscall wabt::ModuleContext::GetLabel(ModuleContext *this,Var *var)

{
  pointer __s2;
  size_t __n;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  pointer pLVar4;
  long lVar5;
  
  if (var->type_ == Index) {
    pLVar4 = (this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = (int)((ulong)((long)(this->label_stack_).
                                super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pLVar4) >> 3) *
            -0x45d1745d;
    if ((var->field_2).index_ < uVar3) {
      uVar2 = (ulong)(uVar3 + ~(var->field_2).index_);
LAB_00139953:
      return pLVar4 + uVar2;
    }
  }
  else {
    if (var->type_ != Name) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                    ,0x3b,"Index wabt::Var::index() const");
    }
    pLVar4 = (this->label_stack_).super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(this->label_stack_).
                   super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pLVar4 >> 3) * 0x2e8ba2e8ba2e8ba3;
    if ((int)uVar2 != 0) {
      __s2 = (var->field_2).name_._M_dataplus._M_p;
      __n = (var->field_2).name_._M_string_length;
      uVar2 = uVar2 & 0xffffffff;
      lVar5 = uVar2 * 0x58;
      do {
        uVar2 = uVar2 - 1;
        if (*(size_t *)((long)pLVar4 + lVar5 + -0x50) == __n) {
          if (__n == 0) {
            return (Label *)((long)&pLVar4[-1].name._M_dataplus._M_p + lVar5);
          }
          iVar1 = bcmp(*(void **)((long)&pLVar4[-1].name._M_dataplus._M_p + lVar5),__s2,__n);
          if (iVar1 == 0) goto LAB_00139953;
        }
        lVar5 = lVar5 + -0x58;
      } while (lVar5 != 0);
    }
  }
  return (Label *)0x0;
}

Assistant:

Index ModuleContext::GetLabelArity(const Var& var) const {
  auto label = GetLabel(var);
  if (!label) {
    return 0;
  }

  return label->label_type == LabelType::Loop ? label->param_types.size()
                                              : label->result_types.size();
}